

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_mir_fold.hpp
# Opt level: O2

void __thiscall
optimization::var_mir_fold::VarMirFold::optimize_func
          (VarMirFold *this,string *name,MirFunction *mirFunction)

{
  _Base_ptr *this_00;
  char cVar1;
  char cVar2;
  uint32_t uVar3;
  Inst *pIVar4;
  int iVar5;
  reference pvVar6;
  _Base_ptr p_Var7;
  ulong __n;
  unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_> *this_01;
  _Self __tmp;
  undefined1 local_70 [8];
  _Head_base<0UL,_mir::inst::Inst_*,_false> local_68;
  undefined4 local_60;
  undefined1 local_50;
  undefined2 local_4f;
  undefined1 local_48 [16];
  _Rb_tree_node_base *local_38;
  
  p_Var7 = (mirFunction->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(mirFunction->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_48._8_8_ = &PTR_display_001dafa8;
  do {
    if (p_Var7 == local_38) {
      return;
    }
    this_00 = &p_Var7[3]._M_parent;
    for (__n = 0; __n < (ulong)((long)p_Var7[3]._M_left - (long)p_Var7[3]._M_parent >> 3);
        __n = __n + 1) {
      pvVar6 = std::
               vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
               ::at((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     *)this_00,__n);
      pIVar4 = (pvVar6->_M_t).
               super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
               super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
      iVar5 = (*(pIVar4->super_Displayable)._vptr_Displayable[1])(pIVar4);
      if (iVar5 != 1) goto switchD_0011a834_default;
      switch(pIVar4[3].dest.id) {
      case 0:
        if ((*(char *)&pIVar4[2].super_Displayable._vptr_Displayable == '\0') &&
           (*(int *)&pIVar4[1].dest.super_Displayable._vptr_Displayable == 0)) {
          std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                    ((VarId *)local_70,(Value *)&pIVar4->dest);
          local_68._M_head_impl = (Inst *)local_70;
          local_70 = (undefined1  [8])0x0;
          replaceInst(this,(vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                            *)this_00,__n,
                      (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                      &local_68);
        }
        else {
          if ((*(char *)&pIVar4[3].dest.super_Displayable._vptr_Displayable != '\0') ||
             (pIVar4[2].dest.id != 0)) break;
          std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                    ((VarId *)local_70,(Value *)&pIVar4->dest);
          local_68._M_head_impl = (Inst *)local_70;
          local_70 = (undefined1  [8])0x0;
          replaceInst(this,(vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                            *)this_00,__n,
                      (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                      &local_68);
        }
LAB_0011ab31:
        if (local_68._M_head_impl != (Inst *)0x0) {
          (*((local_68._M_head_impl)->super_Displayable)._vptr_Displayable[5])();
        }
        local_68._M_head_impl = (Inst *)0x0;
        this_01 = (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_> *)
                  local_70;
        goto LAB_0011ab4c;
      case 1:
        if ((*(char *)&pIVar4[3].dest.super_Displayable._vptr_Displayable == '\0') &&
           (pIVar4[2].dest.id == 0)) {
          std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                    ((VarId *)local_70,(Value *)&pIVar4->dest);
          local_68._M_head_impl = (Inst *)local_70;
          local_70 = (undefined1  [8])0x0;
          replaceInst(this,(vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                            *)this_00,__n,
                      (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                      &local_68);
          goto LAB_0011ab31;
        }
        break;
      case 2:
        cVar1 = *(char *)&pIVar4[2].super_Displayable._vptr_Displayable;
        iVar5 = *(int *)&pIVar4[1].dest.super_Displayable._vptr_Displayable;
        if (cVar1 != '\0' || iVar5 != 0) {
          cVar2 = *(char *)&pIVar4[3].dest.super_Displayable._vptr_Displayable;
          uVar3 = pIVar4[2].dest.id;
          if (uVar3 != 0 || cVar2 != '\0') {
            if (iVar5 == 1 && cVar1 == '\0') {
              std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                        ((VarId *)local_70,(Value *)&pIVar4->dest);
              local_68._M_head_impl = (Inst *)local_70;
              local_70 = (undefined1  [8])0x0;
              replaceInst(this,(vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                *)this_00,__n,
                          (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          &local_68);
            }
            else {
              if (uVar3 != 1 || cVar2 != '\0') break;
              std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                        ((VarId *)local_70,(Value *)&pIVar4->dest);
              local_68._M_head_impl = (Inst *)local_70;
              local_70 = (undefined1  [8])0x0;
              replaceInst(this,(vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                                *)this_00,__n,
                          (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          &local_68);
            }
            goto LAB_0011ab31;
          }
        }
        local_60 = 0;
        local_50 = 0;
        local_68._M_head_impl = (Inst *)local_48._8_8_;
        local_4f = 1;
        std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value>
                  ((VarId *)local_48,(Value *)&pIVar4->dest);
        local_70 = (undefined1  [8])local_48._0_8_;
        local_48._0_8_ =
             (__uniq_ptr_impl<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>)
             0x0;
        replaceInst(this,(vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          *)this_00,__n,
                    (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_70);
LAB_0011a982:
        if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_70 !=
            (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) {
          (**(code **)(*(_func_int **)local_70 + 0x28))();
        }
        local_70 = (undefined1  [8])0x0;
        this_01 = (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_> *)
                  local_48;
LAB_0011ab4c:
        std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
        ~unique_ptr(this_01);
        break;
      case 3:
        if ((*(char *)&pIVar4[2].super_Displayable._vptr_Displayable == '\0') &&
           (*(int *)&pIVar4[1].dest.super_Displayable._vptr_Displayable == 0)) {
          local_60 = 0;
          local_50 = 0;
          local_68._M_head_impl = (Inst *)local_48._8_8_;
          local_4f = 1;
          std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value>
                    ((VarId *)local_48,(Value *)&pIVar4->dest);
          local_70 = (undefined1  [8])local_48._0_8_;
          local_48._0_8_ =
               (__uniq_ptr_impl<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>)
               0x0;
          replaceInst(this,(vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                            *)this_00,__n,
                      (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_70
                     );
          goto LAB_0011a982;
        }
        if ((*(char *)&pIVar4[3].dest.super_Displayable._vptr_Displayable == '\0') &&
           (pIVar4[2].dest.id == 1)) {
          std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::Value&>
                    ((VarId *)local_70,(Value *)&pIVar4->dest);
          local_68._M_head_impl = (Inst *)local_70;
          local_70 = (undefined1  [8])0x0;
          replaceInst(this,(vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                            *)this_00,__n,
                      (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                      &local_68);
          goto LAB_0011ab31;
        }
      }
switchD_0011a834_default:
    }
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

void optimize_func(const std::string& name,
                     mir::inst::MirFunction& mirFunction) {
    for (auto blksIter = mirFunction.basic_blks.begin();
         blksIter != mirFunction.basic_blks.end(); blksIter++) {
      for (size_t i = 0; i < blksIter->second.inst.size(); i++) {
        mir::inst::Inst* inst =
            blksIter->second.inst.at(i).get();
        switch (inst->inst_kind()) {
          case mir::inst::InstKind::Op: {
            mir::inst::OpInst* opInst = (mir::inst::OpInst*) inst;
            switch (opInst->op) {
              case mir::inst::Op::Add: {
                if (isSpecifyImmediate(opInst->lhs, 0)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, opInst->rhs));
                } else if (isSpecifyImmediate(opInst->rhs, 0)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, opInst->lhs));
                }
                break;
              }
              case mir::inst::Op::Sub: {
                if (isSpecifyImmediate(opInst->rhs, 0)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, opInst->lhs));
                }
                break;
              }
              case mir::inst::Op::Mul: {
                if (isSpecifyImmediate(opInst->lhs, 0) ||
                    isSpecifyImmediate(opInst->rhs, 0)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, mir::inst::Value(0)));
                } else if (isSpecifyImmediate(opInst->lhs, 1)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, opInst->rhs));
                } else if (isSpecifyImmediate(opInst->rhs, 1)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, opInst->lhs));
                }
                break;
              }
              case mir::inst::Op::Div: {
                if (isSpecifyImmediate(opInst->lhs, 0)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, mir::inst::Value(0)));
                } else if (isSpecifyImmediate(opInst->rhs, 1)) {
                  replaceInst(blksIter->second.inst, i,
                              std::make_unique<mir::inst::AssignInst>(
                                  opInst->dest, opInst->lhs));
                }
                break;
              }
              case mir::inst::Op::Rem: {
                break;
              }
              default:
                break;
            }
            break;
          }
          case mir::inst::InstKind::PtrOffset: {
            break;
          }
          default:
            break;
        }
      }
    }
  }